

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O0

void __thiscall QKeySequenceEdit::QKeySequenceEdit(QKeySequenceEdit *this,QWidget *parent)

{
  long lVar1;
  QWidget *parent_00;
  QKeySequenceEditPrivate *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QKeySequenceEditPrivate *this_00;
  QFlagsStorage<Qt::WindowType> f;
  
  f.i = (Int)((ulong)in_RDI >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parent_00 = (QWidget *)operator_new(0x2a0);
  QKeySequenceEditPrivate::QKeySequenceEditPrivate(in_RSI);
  this_00 = in_RSI;
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x5a6cec);
  QKeySequenceEdit((QKeySequenceEdit *)this_00,in_RSI,parent_00,(WindowFlags)f.i);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QKeySequenceEdit::QKeySequenceEdit(QWidget *parent)
    : QKeySequenceEdit(*new QKeySequenceEditPrivate, parent, { })
{
}